

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O3

void __thiscall docopt::value::throwIfNotKind(value *this,Kind expected)

{
  runtime_error *this_00;
  string error;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->kind == expected) {
    return;
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Illegal cast to ","");
  std::__cxx11::string::append((char *)local_40);
  std::__cxx11::string::append((char *)local_40);
  std::__cxx11::string::append((char *)local_40);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throwIfNotKind(Kind expected) const {
			if (kind == expected)
				return;

			std::string error = "Illegal cast to ";
			error += kindAsString(expected);
			error += "; type is actually ";
			error += kindAsString(kind);
			throw std::runtime_error(std::move(error));
		}